

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O0

ulong __thiscall nuraft::peer::get_last_sent_idx(peer *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return *(ulong *)(in_RDI + 0x1d0);
}

Assistant:

ulong get_last_sent_idx() const     { return last_sent_idx_.load(); }